

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O3

pair<unsigned_long,_std::tuple<int>_> __thiscall
cppqc::detail::
doShrink<int,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
          (detail *this,
          Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
          *prop,Input *in,duration<double,_std::ratio<1L,_1L>_> timeout,ostream *out)

{
  _Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_false> _Var1;
  bool bVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  int *piVar8;
  pair<unsigned_long,_std::tuple<int>_> pVar9;
  Input shrunk;
  Input input;
  vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> shrinks;
  _Head_base<0UL,_int,_false> local_70;
  _Head_base<0UL,_int,_false> local_6c;
  long local_68;
  detail *local_60;
  ostream *local_58;
  rep_conflict local_50;
  int *local_48;
  int *local_40;
  
  local_70._M_head_impl =
       (in->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl;
  local_68 = 0;
  local_60 = this;
  local_58 = out;
  local_50 = timeout.__r;
  lVar5 = std::chrono::_V2::steady_clock::now();
  do {
    _Var1._M_head_impl =
         (prop->m_gen).m_gen._M_t.
         super___uniq_ptr_impl<cppqc::detail::GenConcept<std::tuple<int>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<int>_>_>_>
         .super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<int>_>_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_GenConcept[3])(&local_48,_Var1._M_head_impl,&local_70);
    piVar3 = local_40;
    piVar8 = local_48;
    if (local_48 == local_40) {
      bVar2 = true;
      uVar7 = extraout_RDX;
    }
    else {
      do {
        local_6c._M_head_impl = *piVar8;
        lVar6 = std::chrono::_V2::steady_clock::now();
        if (local_50 <= (double)(lVar6 - lVar5) / 1000000000.0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_58,"Shrinking timed out...\n",0x17);
          uVar7 = extraout_RDX_01;
          break;
        }
        iVar4 = (*(prop->super_PropertyBase)._vptr_PropertyBase[6])(prop,&local_6c);
        uVar7 = extraout_RDX_00;
        if ((char)iVar4 == '\0') {
          local_70._M_head_impl = local_6c._M_head_impl;
          local_68 = local_68 + 1;
          bVar2 = false;
          goto LAB_00107149;
        }
        piVar8 = piVar8 + 1;
      } while (piVar8 != piVar3);
      bVar2 = true;
    }
LAB_00107149:
    if (local_48 != (int *)0x0) {
      operator_delete(local_48);
      uVar7 = extraout_RDX_02;
    }
    if (bVar2) {
      *(long *)local_60 = local_68;
      *(int *)(local_60 + 8) = local_70._M_head_impl;
      pVar9._8_8_ = uVar7;
      pVar9.first = (unsigned_long)local_60;
      return pVar9;
    }
  } while( true );
}

Assistant:

std::pair<std::size_t, typename Property<T0, T1, T2, T3, T4>::Input> doShrink(
    const Property<T0, T1, T2, T3, T4>& prop,
    const typename Property<T0, T1, T2, T3, T4>::Input& in,
    std::chrono::duration<double> timeout,
    std::ostream& out = std::cout) {
  using Input = typename Property<T0, T1, T2, T3, T4>::Input;

  std::size_t numShrinks = 0;
  Input shrunk = in;
  const auto start = std::chrono::steady_clock::now();

  auto isTimeoutReached = [start, timeout]() {
    const std::chrono::duration<double> elapsed =
        std::chrono::steady_clock::now() - start;
    return elapsed >= timeout;
  };

  try {
  continueShrinking:
    std::vector<Input> shrinks = prop.shrinkInput(shrunk);
    for (Input input : shrinks) {
      if (isTimeoutReached()) {
        out << "Shrinking timed out...\n";
        break;
      }

      if (!prop.checkInput(input)) {
        shrunk = std::move(input);
        numShrinks++;
        goto continueShrinking;
      }
    }
  } catch (...) {
  }
  return std::make_pair(numShrinks, shrunk);
}